

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void CTcAbsFixup::fix_abs_fixup(CTcAbsFixup *list_head,ulong final_ofs)

{
  ulong in_RSI;
  undefined8 *in_RDI;
  CTcAbsFixup *cur;
  undefined8 local_18;
  
  for (local_18 = in_RDI; local_18 != (undefined8 *)0x0; local_18 = (undefined8 *)*local_18) {
    CTcDataStream::write4_at((CTcDataStream *)cur,(ulong)in_RDI,in_RSI);
  }
  return;
}

Assistant:

void CTcAbsFixup::fix_abs_fixup(CTcAbsFixup *list_head, ulong final_ofs)
{
    CTcAbsFixup *cur;

    /* scan the list and fix up each entry */
    for (cur = list_head ; cur != 0 ; cur = cur->nxt)
    {
        /* 
         *   fix this entry by writing the final offset in UINT4 format to
         *   the target stream at the target offset 
         */
        cur->ds->write4_at(cur->ofs, final_ofs);
    }
}